

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  CodedInputStream *in_stack_000000a8;
  undefined1 in_stack_000000d0 [24];
  
  bVar1 = ParseMessageSetItemImpl<google::protobuf::internal::ExtensionSet::ParseMessageSetItemLite(google::protobuf::io::CodedInputStream*,google::protobuf::internal::ExtensionFinder*,google::protobuf::internal::FieldSkipper*)::MSLite>
                    (in_stack_000000a8,(MSLite)in_stack_000000d0);
  return bVar1;
}

Assistant:

bool ExtensionSet::ParseMessageSetItemLite(io::CodedInputStream* input,
                                           ExtensionFinder* extension_finder,
                                           FieldSkipper* field_skipper) {
  struct MSLite {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      return me->ParseField(
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED + 8 * type_id, input,
          extension_finder, field_skipper);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return field_skipper->SkipField(input, tag);
    }

    ExtensionSet* me;
    ExtensionFinder* extension_finder;
    FieldSkipper* field_skipper;
  };

  return ParseMessageSetItemImpl(input,
                                 MSLite{this, extension_finder, field_skipper});
}